

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURL ** curl_multi_get_handles(CURLM *m)

{
  CURL **ppCVar1;
  void *pvVar2;
  Curl_easy *data;
  Curl_llist_node *e;
  uint i;
  CURL **a;
  Curl_multi *multi;
  CURLM *m_local;
  
  ppCVar1 = (CURL **)(*Curl_cmalloc)((ulong)(*(int *)((long)m + 4) + 1) << 3);
  if (ppCVar1 != (CURL **)0x0) {
    e._4_4_ = 0;
    for (data = (Curl_easy *)Curl_llist_head((Curl_llist *)((long)m + 0x30));
        data != (Curl_easy *)0x0; data = (Curl_easy *)Curl_node_next((Curl_llist_node *)data)) {
      pvVar2 = Curl_node_elem((Curl_llist_node *)data);
      if ((*(uint *)((long)pvVar2 + 0x13c6) >> 0x14 & 1) == 0) {
        ppCVar1[e._4_4_] = pvVar2;
        e._4_4_ = e._4_4_ + 1;
      }
    }
    ppCVar1[e._4_4_] = (CURL *)0x0;
  }
  return ppCVar1;
}

Assistant:

CURL **curl_multi_get_handles(CURLM *m)
{
  struct Curl_multi *multi = m;
  CURL **a = malloc(sizeof(struct Curl_easy *) * (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_llist_node *e;
    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      struct Curl_easy *data = Curl_node_elem(e);
      DEBUGASSERT(i < multi->num_easy);
      if(!data->state.internal)
        a[i++] = data;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}